

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clGetGLContextInfoKHR
                 (cl_context_properties *properties,cl_gl_context_info param_name,
                 size_t param_value_size,void *param_value,size_t *param_value_size_ret)

{
  CLIntercept *this;
  byte bVar1;
  cl_int errorCode;
  time_point end;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar2;
  allocator local_61;
  time_point local_60;
  uint64_t local_58;
  string local_50;
  
  this = g_pIntercept;
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x20;
  }
  if ((g_pIntercept->m_Dispatch).clGetGLContextInfoKHR == (cl_api_clGetGLContextInfoKHR)0x0) {
    return -0x20;
  }
  local_58 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((g_pIntercept->m_Config).CallLogging == true) {
    local_60.__d.__r = (duration)(duration)param_value_size_ret;
    CEnumNameMap::name_abi_cxx11_(&local_50,&g_pIntercept->m_EnumNameMap,param_name);
    CLIntercept::callLoggingEnter
              (this,"clGetGLContextInfoKHR",local_58,(cl_kernel)0x0,"param_name = %s (%08X)",
               local_50._M_dataplus._M_p,CONCAT44(uVar2,param_name));
    std::__cxx11::string::~string((string *)&local_50);
    param_value_size_ret = (size_t *)local_60;
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clGetGLContextInfoKHR)
                        (properties,param_name,param_value_size,param_value,param_value_size_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_58 &&
        (local_58 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_61);
      CLIntercept::updateHostTimingStats(this,"clGetGLContextInfoKHR",&local_50,local_60,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar1 = (this->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0012fc4e;
    }
    else if (errorCode == 0) goto LAB_0012fc25;
  }
  else {
    if (errorCode == 0) {
LAB_0012fc25:
      errorCode = 0;
      goto LAB_0012fc4e;
    }
    CLIntercept::logError(this,"clGetGLContextInfoKHR",errorCode);
    bVar1 = (this->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0012fc4e:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clGetGLContextInfoKHR",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_61);
    CLIntercept::chromeCallLoggingExit(this,"clGetGLContextInfoKHR",&local_50,false,0,local_60,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clGetGLContextInfoKHR(
    const cl_context_properties *properties,
    cl_gl_context_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clGetGLContextInfoKHR )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "param_name = %s (%08X)",
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetGLContextInfoKHR(
            properties,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret);

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_PLATFORM);
}